

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void decodeGeneric(uchar **out,uint *w,uint *h,LodePNGState *state,uchar *in,size_t insize)

{
  uchar uVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  void *pvVar5;
  bool bVar6;
  size_t bpp_1;
  size_t bpp;
  size_t newsize;
  size_t pos;
  uchar *data;
  int local_80;
  uint chunkLength;
  uint critical_pos;
  uint unknown;
  size_t outsize;
  size_t expected_size;
  size_t scanlines_size;
  uchar *scanlines;
  size_t idatsize;
  uchar *idat;
  uchar *chunk;
  ulong uStack_38;
  uchar IEND;
  size_t insize_local;
  uchar *in_local;
  LodePNGState *state_local;
  uint *h_local;
  uint *w_local;
  uchar **out_local;
  
  chunk._7_1_ = '\0';
  scanlines = (uchar *)0x0;
  scanlines_size = 0;
  expected_size = 0;
  outsize = 0;
  _critical_pos = 0;
  chunkLength = 0;
  local_80 = 1;
  *out = (uchar *)0x0;
  *h = 0;
  *w = 0;
  uStack_38 = insize;
  insize_local = (size_t)in;
  in_local = (uchar *)state;
  state_local = (LodePNGState *)h;
  h_local = w;
  w_local = (uint *)out;
  uVar2 = lodepng_inspect(w,h,state,in,insize);
  *(uint *)(in_local + 0x218) = uVar2;
  if (*(int *)(in_local + 0x218) == 0) {
    iVar3 = lodepng_pixel_overflow
                      (*h_local,(state_local->decoder).zlibsettings.ignore_adler32,
                       (LodePNGColorMode *)(in_local + 0xe0),(LodePNGColorMode *)(in_local + 0xa8));
    if (iVar3 == 0) {
      idatsize = (size_t)lodepng_malloc(uStack_38);
      if ((void *)idatsize != (void *)0x0) {
        idat = (uchar *)(insize_local + 0x21);
        do {
          bVar6 = false;
          if (chunk._7_1_ == '\0') {
            bVar6 = *(int *)(in_local + 0x218) == 0;
          }
          if (!bVar6) goto LAB_002aa852;
          newsize = (long)idat - insize_local;
          if ((idat < insize_local) || (uStack_38 < newsize + 0xc)) {
            if (*(int *)(in_local + 0x30) == 0) {
              in_local[0x218] = '\x1e';
              in_local[0x219] = '\0';
              in_local[0x21a] = '\0';
              in_local[0x21b] = '\0';
            }
            goto LAB_002aa852;
          }
          data._4_4_ = lodepng_chunk_length(idat);
          if (0x7fffffff < data._4_4_) {
            if (*(int *)(in_local + 0x30) == 0) {
              in_local[0x218] = '?';
              in_local[0x219] = '\0';
              in_local[0x21a] = '\0';
              in_local[0x21b] = '\0';
            }
            goto LAB_002aa852;
          }
          if ((uStack_38 < newsize + data._4_4_ + 0xc) || (newsize + data._4_4_ + 0xc < newsize)) {
            in_local[0x218] = '@';
            in_local[0x219] = '\0';
            in_local[0x21a] = '\0';
            in_local[0x21b] = '\0';
            goto LAB_002aa852;
          }
          pos = (size_t)lodepng_chunk_data_const(idat);
          chunkLength = 0;
          uVar1 = lodepng_chunk_type_equals(idat,"IDAT");
          if (uVar1 == '\0') {
            uVar1 = lodepng_chunk_type_equals(idat,"IEND");
            if (uVar1 == '\0') {
              uVar1 = lodepng_chunk_type_equals(idat,"PLTE");
              if (uVar1 == '\0') {
                uVar1 = lodepng_chunk_type_equals(idat,"tRNS");
                if (uVar1 == '\0') {
                  uVar1 = lodepng_chunk_type_equals(idat,"bKGD");
                  if (uVar1 == '\0') {
                    uVar1 = lodepng_chunk_type_equals(idat,"tEXt");
                    if (uVar1 == '\0') {
                      uVar1 = lodepng_chunk_type_equals(idat,"zTXt");
                      if (uVar1 == '\0') {
                        uVar1 = lodepng_chunk_type_equals(idat,"iTXt");
                        if (uVar1 == '\0') {
                          uVar1 = lodepng_chunk_type_equals(idat,"tIME");
                          if (uVar1 == '\0') {
                            uVar1 = lodepng_chunk_type_equals(idat,"pHYs");
                            if (uVar1 == '\0') {
                              uVar1 = lodepng_chunk_type_equals(idat,"gAMA");
                              if (uVar1 == '\0') {
                                uVar1 = lodepng_chunk_type_equals(idat,"cHRM");
                                if (uVar1 == '\0') {
                                  uVar1 = lodepng_chunk_type_equals(idat,"sRGB");
                                  if (uVar1 == '\0') {
                                    uVar1 = lodepng_chunk_type_equals(idat,"iCCP");
                                    if (uVar1 == '\0') {
                                      uVar1 = lodepng_chunk_type_equals(idat,"sBIT");
                                      if (uVar1 == '\0') {
                                        if ((*(int *)(in_local + 0x2c) == 0) &&
                                           (uVar1 = lodepng_chunk_ancillary(idat), uVar1 == '\0')) {
                                          in_local[0x218] = 'E';
                                          in_local[0x219] = '\0';
                                          in_local[0x21a] = '\0';
                                          in_local[0x21b] = '\0';
                                          goto LAB_002aa852;
                                        }
                                        chunkLength = 1;
                                        if (*(int *)(in_local + 0x3c) == 0) goto LAB_002aa802;
                                        uVar2 = lodepng_chunk_append
                                                          ((uchar **)
                                                           (in_local +
                                                           (ulong)(local_80 - 1) * 8 + 0x1e8),
                                                           (size_t *)
                                                           (in_local +
                                                           (ulong)(local_80 - 1) * 8 + 0x200),idat);
                                        *(uint *)(in_local + 0x218) = uVar2;
                                        iVar3 = *(int *)(in_local + 0x218);
                                      }
                                      else {
                                        uVar2 = readChunk_sBIT((LodePNGInfo *)(in_local + 0xd0),
                                                               (uchar *)pos,(ulong)data._4_4_);
                                        *(uint *)(in_local + 0x218) = uVar2;
                                        iVar3 = *(int *)(in_local + 0x218);
                                      }
                                    }
                                    else {
                                      uVar2 = readChunk_iCCP((LodePNGInfo *)(in_local + 0xd0),
                                                             (LodePNGDecoderSettings *)in_local,
                                                             (uchar *)pos,(ulong)data._4_4_);
                                      *(uint *)(in_local + 0x218) = uVar2;
                                      iVar3 = *(int *)(in_local + 0x218);
                                    }
                                  }
                                  else {
                                    uVar2 = readChunk_sRGB((LodePNGInfo *)(in_local + 0xd0),
                                                           (uchar *)pos,(ulong)data._4_4_);
                                    *(uint *)(in_local + 0x218) = uVar2;
                                    iVar3 = *(int *)(in_local + 0x218);
                                  }
                                }
                                else {
                                  uVar2 = readChunk_cHRM((LodePNGInfo *)(in_local + 0xd0),
                                                         (uchar *)pos,(ulong)data._4_4_);
                                  *(uint *)(in_local + 0x218) = uVar2;
                                  iVar3 = *(int *)(in_local + 0x218);
                                }
                              }
                              else {
                                uVar2 = readChunk_gAMA((LodePNGInfo *)(in_local + 0xd0),(uchar *)pos
                                                       ,(ulong)data._4_4_);
                                *(uint *)(in_local + 0x218) = uVar2;
                                iVar3 = *(int *)(in_local + 0x218);
                              }
                              if (iVar3 == 0) goto LAB_002aa802;
                              goto LAB_002aa852;
                            }
                            uVar2 = readChunk_pHYs((LodePNGInfo *)(in_local + 0xd0),(uchar *)pos,
                                                   (ulong)data._4_4_);
                            *(uint *)(in_local + 0x218) = uVar2;
                            iVar3 = *(int *)(in_local + 0x218);
                          }
                          else {
                            uVar2 = readChunk_tIME((LodePNGInfo *)(in_local + 0xd0),(uchar *)pos,
                                                   (ulong)data._4_4_);
                            *(uint *)(in_local + 0x218) = uVar2;
                            iVar3 = *(int *)(in_local + 0x218);
                          }
                        }
                        else {
                          if (*(int *)(in_local + 0x38) == 0) goto LAB_002aa802;
                          uVar2 = readChunk_iTXt((LodePNGInfo *)(in_local + 0xd0),
                                                 (LodePNGDecoderSettings *)in_local,(uchar *)pos,
                                                 (ulong)data._4_4_);
                          *(uint *)(in_local + 0x218) = uVar2;
                          iVar3 = *(int *)(in_local + 0x218);
                        }
                      }
                      else {
                        if (*(int *)(in_local + 0x38) == 0) goto LAB_002aa802;
                        uVar2 = readChunk_zTXt((LodePNGInfo *)(in_local + 0xd0),
                                               (LodePNGDecoderSettings *)in_local,(uchar *)pos,
                                               (ulong)data._4_4_);
                        *(uint *)(in_local + 0x218) = uVar2;
                        iVar3 = *(int *)(in_local + 0x218);
                      }
                    }
                    else {
                      if (*(int *)(in_local + 0x38) == 0) goto LAB_002aa802;
                      uVar2 = readChunk_tEXt((LodePNGInfo *)(in_local + 0xd0),(uchar *)pos,
                                             (ulong)data._4_4_);
                      *(uint *)(in_local + 0x218) = uVar2;
                      iVar3 = *(int *)(in_local + 0x218);
                    }
                  }
                  else {
                    uVar2 = readChunk_bKGD((LodePNGInfo *)(in_local + 0xd0),(uchar *)pos,
                                           (ulong)data._4_4_);
                    *(uint *)(in_local + 0x218) = uVar2;
                    iVar3 = *(int *)(in_local + 0x218);
                  }
                }
                else {
                  uVar2 = readChunk_tRNS((LodePNGColorMode *)(in_local + 0xe0),(uchar *)pos,
                                         (ulong)data._4_4_);
                  *(uint *)(in_local + 0x218) = uVar2;
                  iVar3 = *(int *)(in_local + 0x218);
                }
                if (iVar3 != 0) goto LAB_002aa852;
              }
              else {
                uVar2 = readChunk_PLTE((LodePNGColorMode *)(in_local + 0xe0),(uchar *)pos,
                                       (ulong)data._4_4_);
                *(uint *)(in_local + 0x218) = uVar2;
                if (*(int *)(in_local + 0x218) != 0) goto LAB_002aa852;
                local_80 = 2;
              }
            }
            else {
              chunk._7_1_ = '\x01';
            }
          }
          else {
            iVar3 = lodepng_addofl((size_t)scanlines,(ulong)data._4_4_,&bpp);
            if (iVar3 != 0) {
              in_local[0x218] = '_';
              in_local[0x219] = '\0';
              in_local[0x21a] = '\0';
              in_local[0x21b] = '\0';
              goto LAB_002aa852;
            }
            if (uStack_38 < bpp) {
              in_local[0x218] = '_';
              in_local[0x219] = '\0';
              in_local[0x21a] = '\0';
              in_local[0x21b] = '\0';
              goto LAB_002aa852;
            }
            lodepng_memcpy(scanlines + idatsize,(void *)pos,(ulong)data._4_4_);
            scanlines = scanlines + data._4_4_;
            local_80 = 3;
          }
LAB_002aa802:
          if (((*(int *)(in_local + 0x28) == 0) && (chunkLength == 0)) &&
             (uVar2 = lodepng_chunk_check_crc(idat), uVar2 != 0)) {
            in_local[0x218] = '9';
            in_local[0x219] = '\0';
            in_local[0x21a] = '\0';
            in_local[0x21b] = '\0';
LAB_002aa852:
            if (((*(int *)(in_local + 0x218) == 0) && (*(int *)(in_local + 0xe0) == 3)) &&
               (*(long *)(in_local + 0xe8) == 0)) {
              in_local[0x218] = 'j';
              in_local[0x219] = '\0';
              in_local[0x21a] = '\0';
              in_local[0x21b] = '\0';
            }
            if (*(int *)(in_local + 0x218) == 0) {
              if (*(int *)(in_local + 0xd8) == 0) {
                uVar2 = lodepng_get_bpp((LodePNGColorMode *)(in_local + 0xe0));
                outsize = lodepng_get_raw_size_idat
                                    (*h_local,(state_local->decoder).zlibsettings.ignore_adler32,
                                     uVar2);
              }
              else {
                uVar2 = lodepng_get_bpp((LodePNGColorMode *)(in_local + 0xe0));
                outsize = 0;
                sVar4 = lodepng_get_raw_size_idat
                                  (*h_local + 7 >> 3,
                                   (state_local->decoder).zlibsettings.ignore_adler32 + 7 >> 3,uVar2
                                  );
                outsize = sVar4 + outsize;
                if (4 < *h_local) {
                  sVar4 = lodepng_get_raw_size_idat
                                    (*h_local + 3 >> 3,
                                     (state_local->decoder).zlibsettings.ignore_adler32 + 7 >> 3,
                                     uVar2);
                  outsize = sVar4 + outsize;
                }
                sVar4 = lodepng_get_raw_size_idat
                                  (*h_local + 3 >> 2,
                                   (state_local->decoder).zlibsettings.ignore_adler32 + 3 >> 3,uVar2
                                  );
                outsize = sVar4 + outsize;
                if (2 < *h_local) {
                  sVar4 = lodepng_get_raw_size_idat
                                    (*h_local + 1 >> 2,
                                     (state_local->decoder).zlibsettings.ignore_adler32 + 3 >> 2,
                                     uVar2);
                  outsize = sVar4 + outsize;
                }
                sVar4 = lodepng_get_raw_size_idat
                                  (*h_local + 1 >> 1,
                                   (state_local->decoder).zlibsettings.ignore_adler32 + 1 >> 2,uVar2
                                  );
                outsize = sVar4 + outsize;
                if (1 < *h_local) {
                  sVar4 = lodepng_get_raw_size_idat
                                    (*h_local >> 1,
                                     (state_local->decoder).zlibsettings.ignore_adler32 + 1 >> 1,
                                     uVar2);
                  outsize = sVar4 + outsize;
                }
                sVar4 = lodepng_get_raw_size_idat
                                  (*h_local,(state_local->decoder).zlibsettings.ignore_adler32 >> 1,
                                   uVar2);
                outsize = sVar4 + outsize;
              }
              uVar2 = zlib_decompress((uchar **)&scanlines_size,&expected_size,outsize,
                                      (uchar *)idatsize,(size_t)scanlines,
                                      (LodePNGDecompressSettings *)in_local);
              *(uint *)(in_local + 0x218) = uVar2;
            }
            if ((*(int *)(in_local + 0x218) == 0) && (expected_size != outsize)) {
              in_local[0x218] = '[';
              in_local[0x219] = '\0';
              in_local[0x21a] = '\0';
              in_local[0x21b] = '\0';
            }
            lodepng_free((void *)idatsize);
            if (*(int *)(in_local + 0x218) == 0) {
              _critical_pos =
                   lodepng_get_raw_size
                             (*h_local,(state_local->decoder).zlibsettings.ignore_adler32,
                              (LodePNGColorMode *)(in_local + 0xe0));
              pvVar5 = lodepng_malloc(_critical_pos);
              *(void **)w_local = pvVar5;
              if (*(long *)w_local == 0) {
                in_local[0x218] = 'S';
                in_local[0x219] = '\0';
                in_local[0x21a] = '\0';
                in_local[0x21b] = '\0';
              }
            }
            if (*(int *)(in_local + 0x218) == 0) {
              lodepng_memset(*(void **)w_local,0,_critical_pos);
              uVar2 = postProcessScanlines
                                (*(uchar **)w_local,(uchar *)scanlines_size,*h_local,
                                 (state_local->decoder).zlibsettings.ignore_adler32,
                                 (LodePNGInfo *)(in_local + 0xd0));
              *(uint *)(in_local + 0x218) = uVar2;
            }
            lodepng_free((void *)scanlines_size);
            return;
          }
          if (chunk._7_1_ == '\0') {
            idat = lodepng_chunk_next_const(idat,(uchar *)(insize_local + uStack_38));
          }
        } while( true );
      }
      in_local[0x218] = 'S';
      in_local[0x219] = '\0';
      in_local[0x21a] = '\0';
      in_local[0x21b] = '\0';
    }
    else {
      in_local[0x218] = '\\';
      in_local[0x219] = '\0';
      in_local[0x21a] = '\0';
      in_local[0x21b] = '\0';
    }
  }
  return;
}

Assistant:

static void decodeGeneric(unsigned char** out, unsigned* w, unsigned* h,
                          LodePNGState* state,
                          const unsigned char* in, size_t insize) {
  unsigned char IEND = 0;
  const unsigned char* chunk; /*points to beginning of next chunk*/
  unsigned char* idat; /*the data from idat chunks, zlib compressed*/
  size_t idatsize = 0;
  unsigned char* scanlines = 0;
  size_t scanlines_size = 0, expected_size = 0;
  size_t outsize = 0;

  /*for unknown chunk order*/
  unsigned unknown = 0;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  unsigned critical_pos = 1; /*1 = after IHDR, 2 = after PLTE, 3 = after IDAT*/
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/


  /* safe output values in case error happens */
  *out = 0;
  *w = *h = 0;

  state->error = lodepng_inspect(w, h, state, in, insize); /*reads header and resets other parameters in state->info_png*/
  if(state->error) return;

  if(lodepng_pixel_overflow(*w, *h, &state->info_png.color, &state->info_raw)) {
    CERROR_RETURN(state->error, 92); /*overflow possible due to amount of pixels*/
  }

  /*the input filesize is a safe upper bound for the sum of idat chunks size*/
  idat = (unsigned char*)lodepng_malloc(insize);
  if(!idat) CERROR_RETURN(state->error, 83); /*alloc fail*/

  chunk = &in[33]; /*first byte of the first chunk after the header*/

  /*loop through the chunks, ignoring unknown chunks and stopping at IEND chunk.
  IDAT data is put at the start of the in buffer*/
  while(!IEND && !state->error) {
    unsigned chunkLength;
    const unsigned char* data; /*the data in the chunk*/
    size_t pos = (size_t)(chunk - in);

    /*error: next chunk out of bounds of the in buffer*/
    if(chunk < in || pos + 12 > insize) {
      if(state->decoder.ignore_end) break; /*other errors may still happen though*/
      CERROR_BREAK(state->error, 30);
    }

    /*length of the data of the chunk, excluding the 12 bytes for length, chunk type and CRC*/
    chunkLength = lodepng_chunk_length(chunk);
    /*error: chunk length larger than the max PNG chunk size*/
    if(chunkLength > 2147483647) {
      if(state->decoder.ignore_end) break; /*other errors may still happen though*/
      CERROR_BREAK(state->error, 63);
    }

    if(pos + (size_t)chunkLength + 12 > insize || pos + (size_t)chunkLength + 12 < pos) {
      CERROR_BREAK(state->error, 64); /*error: size of the in buffer too small to contain next chunk (or int overflow)*/
    }

    data = lodepng_chunk_data_const(chunk);

    unknown = 0;

    /*IDAT chunk, containing compressed image data*/
    if(lodepng_chunk_type_equals(chunk, "IDAT")) {
      size_t newsize;
      if(lodepng_addofl(idatsize, chunkLength, &newsize)) CERROR_BREAK(state->error, 95);
      if(newsize > insize) CERROR_BREAK(state->error, 95);
      lodepng_memcpy(idat + idatsize, data, chunkLength);
      idatsize += chunkLength;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      critical_pos = 3;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    } else if(lodepng_chunk_type_equals(chunk, "IEND")) {
      /*IEND chunk*/
      IEND = 1;
    } else if(lodepng_chunk_type_equals(chunk, "PLTE")) {
      /*palette chunk (PLTE)*/
      state->error = readChunk_PLTE(&state->info_png.color, data, chunkLength);
      if(state->error) break;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      critical_pos = 2;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    } else if(lodepng_chunk_type_equals(chunk, "tRNS")) {
      /*palette transparency chunk (tRNS). Even though this one is an ancillary chunk , it is still compiled
      in without 'LODEPNG_COMPILE_ANCILLARY_CHUNKS' because it contains essential color information that
      affects the alpha channel of pixels. */
      state->error = readChunk_tRNS(&state->info_png.color, data, chunkLength);
      if(state->error) break;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      /*background color chunk (bKGD)*/
    } else if(lodepng_chunk_type_equals(chunk, "bKGD")) {
      state->error = readChunk_bKGD(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "tEXt")) {
      /*text chunk (tEXt)*/
      if(state->decoder.read_text_chunks) {
        state->error = readChunk_tEXt(&state->info_png, data, chunkLength);
        if(state->error) break;
      }
    } else if(lodepng_chunk_type_equals(chunk, "zTXt")) {
      /*compressed text chunk (zTXt)*/
      if(state->decoder.read_text_chunks) {
        state->error = readChunk_zTXt(&state->info_png, &state->decoder, data, chunkLength);
        if(state->error) break;
      }
    } else if(lodepng_chunk_type_equals(chunk, "iTXt")) {
      /*international text chunk (iTXt)*/
      if(state->decoder.read_text_chunks) {
        state->error = readChunk_iTXt(&state->info_png, &state->decoder, data, chunkLength);
        if(state->error) break;
      }
    } else if(lodepng_chunk_type_equals(chunk, "tIME")) {
      state->error = readChunk_tIME(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "pHYs")) {
      state->error = readChunk_pHYs(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "gAMA")) {
      state->error = readChunk_gAMA(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "cHRM")) {
      state->error = readChunk_cHRM(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "sRGB")) {
      state->error = readChunk_sRGB(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "iCCP")) {
      state->error = readChunk_iCCP(&state->info_png, &state->decoder, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "sBIT")) {
      state->error = readChunk_sBIT(&state->info_png, data, chunkLength);
      if(state->error) break;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    } else /*it's not an implemented chunk type, so ignore it: skip over the data*/ {
      /*error: unknown critical chunk (5th bit of first byte of chunk type is 0)*/
      if(!state->decoder.ignore_critical && !lodepng_chunk_ancillary(chunk)) {
        CERROR_BREAK(state->error, 69);
      }

      unknown = 1;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      if(state->decoder.remember_unknown_chunks) {
        state->error = lodepng_chunk_append(&state->info_png.unknown_chunks_data[critical_pos - 1],
                                            &state->info_png.unknown_chunks_size[critical_pos - 1], chunk);
        if(state->error) break;
      }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    }

    if(!state->decoder.ignore_crc && !unknown) /*check CRC if wanted, only on known chunk types*/ {
      if(lodepng_chunk_check_crc(chunk)) CERROR_BREAK(state->error, 57); /*invalid CRC*/
    }

    if(!IEND) chunk = lodepng_chunk_next_const(chunk, in + insize);
  }

  if(!state->error && state->info_png.color.colortype == LCT_PALETTE && !state->info_png.color.palette) {
    state->error = 106; /* error: PNG file must have PLTE chunk if color type is palette */
  }

  if(!state->error) {
    /*predict output size, to allocate exact size for output buffer to avoid more dynamic allocation.
    If the decompressed size does not match the prediction, the image must be corrupt.*/
    if(state->info_png.interlace_method == 0) {
      size_t bpp = lodepng_get_bpp(&state->info_png.color);
      expected_size = lodepng_get_raw_size_idat(*w, *h, bpp);
    } else {
      size_t bpp = lodepng_get_bpp(&state->info_png.color);
      /*Adam-7 interlaced: expected size is the sum of the 7 sub-images sizes*/
      expected_size = 0;
      expected_size += lodepng_get_raw_size_idat((*w + 7) >> 3, (*h + 7) >> 3, bpp);
      if(*w > 4) expected_size += lodepng_get_raw_size_idat((*w + 3) >> 3, (*h + 7) >> 3, bpp);
      expected_size += lodepng_get_raw_size_idat((*w + 3) >> 2, (*h + 3) >> 3, bpp);
      if(*w > 2) expected_size += lodepng_get_raw_size_idat((*w + 1) >> 2, (*h + 3) >> 2, bpp);
      expected_size += lodepng_get_raw_size_idat((*w + 1) >> 1, (*h + 1) >> 2, bpp);
      if(*w > 1) expected_size += lodepng_get_raw_size_idat((*w + 0) >> 1, (*h + 1) >> 1, bpp);
      expected_size += lodepng_get_raw_size_idat((*w + 0), (*h + 0) >> 1, bpp);
    }

    state->error = zlib_decompress(&scanlines, &scanlines_size, expected_size, idat, idatsize, &state->decoder.zlibsettings);
  }
  if(!state->error && scanlines_size != expected_size) state->error = 91; /*decompressed size doesn't match prediction*/
  lodepng_free(idat);

  if(!state->error) {
    outsize = lodepng_get_raw_size(*w, *h, &state->info_png.color);
    *out = (unsigned char*)lodepng_malloc(outsize);
    if(!*out) state->error = 83; /*alloc fail*/
  }
  if(!state->error) {
    lodepng_memset(*out, 0, outsize);
    state->error = postProcessScanlines(*out, scanlines, *w, *h, &state->info_png);
  }
  lodepng_free(scanlines);
}